

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<bool> __thiscall
deqp::gls::BuiltinPrecisionTests::exprP<bool>(BuiltinPrecisionTests *this,Expr<bool> *ptr)

{
  SharedPtrStateBase *extraout_RDX;
  ExprP<bool> EVar1;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>_> local_28;
  Expr<bool> *local_18;
  Expr<bool> *ptr_local;
  
  local_18 = ptr;
  ptr_local = (Expr<bool> *)this;
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>_>::SharedPtr(&local_28,ptr);
  exprP<bool>(this,&local_28);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>_>::~SharedPtr(&local_28);
  EVar1.super_ExprPBase<bool>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>_>.
  m_state = extraout_RDX;
  EVar1.super_ExprPBase<bool>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>_>.
  m_ptr = (Expr<bool> *)this;
  return (ExprP<bool>)
         EVar1.super_ExprPBase<bool>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<bool>_>;
}

Assistant:

ExprP<T> exprP (const Expr<T>* ptr)
{
	return exprP(SharedPtr<const Expr<T> >(ptr));
}